

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack6_24(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  
  auVar8 = vpmovsxbd_avx2(ZEXT816(0x101010000000000));
  uVar1 = *(ulong *)in;
  auVar11._8_4_ = 0x3f;
  auVar11._0_8_ = 0x3f0000003f;
  auVar11._12_4_ = 0x3f;
  auVar12._16_4_ = 0x3f;
  auVar12._0_16_ = auVar11;
  auVar12._20_4_ = 0x3f;
  auVar12._24_4_ = 0x3f;
  auVar12._28_4_ = 0x3f;
  *out = (uint)uVar1 & 0x3f;
  uVar4 = (uint)(uVar1 >> 0x20);
  auVar8 = vpermd_avx2(auVar8,ZEXT832(uVar1));
  auVar10 = vpmovsxbd_avx2(ZEXT816(0x100a041e18120c06));
  auVar7 = vpbroadcastd_avx512vl();
  uVar5 = in[2];
  auVar9 = vpsrlvd_avx2(auVar8,auVar10);
  auVar8 = vpand_avx2(auVar9,auVar12);
  auVar9 = vpor_avx2(auVar9,auVar7);
  auVar8 = vpblendd_avx2(auVar8,auVar9,0x10);
  *(undefined1 (*) [32])(out + 1) = auVar8;
  auVar8 = vpbroadcastd_avx512vl();
  auVar2 = vpsrlvd_avx2(auVar8._0_16_,_DAT_0019d410);
  out[9] = uVar4 >> 0x16 & 0x3f;
  uVar1 = *(ulong *)(in + 3);
  out[10] = uVar4 >> 0x1c | (uVar5 & 3) << 4;
  auVar9 = vpsrld_avx2(auVar8,0x1a);
  auVar6 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar6,auVar10._0_16_);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6 = vpshufd_avx(auVar6,0x40);
  auVar8._0_4_ = (undefined4)uVar1;
  auVar8._4_4_ = auVar8._0_4_;
  auVar8._8_4_ = auVar8._0_4_;
  auVar8._12_4_ = auVar8._0_4_;
  auVar8._16_4_ = auVar8._0_4_;
  auVar8._20_4_ = auVar8._0_4_;
  auVar8._24_4_ = auVar8._0_4_;
  auVar8._28_4_ = auVar8._0_4_;
  uVar5 = (uint)(uVar1 >> 0x20);
  auVar10._0_8_ = auVar3._0_8_;
  auVar10._8_8_ = auVar10._0_8_;
  auVar10._16_8_ = auVar10._0_8_;
  auVar10._24_8_ = auVar10._0_8_;
  auVar8 = vpblendd_avx2(ZEXT1632(auVar2),auVar8,0xf0);
  auVar8 = vpblendd_avx2(auVar8,auVar10,0xc0);
  auVar8 = vpand_avx2(auVar8,auVar12);
  auVar8 = vpblendd_avx2(auVar8,auVar9,0x10);
  auVar2 = vpinsrd_avx(auVar11,(uVar5 & 0xf) << 2,2);
  *(undefined1 (*) [32])(out + 0xb) = auVar8;
  auVar3 = vpsrlvd_avx2(auVar6,_DAT_001aadd0);
  auVar6 = vpand_avx(auVar3,auVar11);
  auVar2 = vpor_avx(auVar3,auVar2);
  auVar6 = vpblendd_avx2(auVar6,auVar2,4);
  *(undefined1 (*) [16])(out + 0x13) = auVar6;
  out[0x17] = uVar5 >> 10 & 0x3f;
  return in + 5;
}

Assistant:

const uint32_t *__fastunpack6_24(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 6);
  out++;
  *out = ((*in) >> 6) % (1U << 6);
  out++;
  *out = ((*in) >> 12) % (1U << 6);
  out++;
  *out = ((*in) >> 18) % (1U << 6);
  out++;
  *out = ((*in) >> 24) % (1U << 6);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 4)) << (6 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 6);
  out++;
  *out = ((*in) >> 10) % (1U << 6);
  out++;
  *out = ((*in) >> 16) % (1U << 6);
  out++;
  *out = ((*in) >> 22) % (1U << 6);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 2)) << (6 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 6);
  out++;
  *out = ((*in) >> 8) % (1U << 6);
  out++;
  *out = ((*in) >> 14) % (1U << 6);
  out++;
  *out = ((*in) >> 20) % (1U << 6);
  out++;
  *out = ((*in) >> 26);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 6);
  out++;
  *out = ((*in) >> 6) % (1U << 6);
  out++;
  *out = ((*in) >> 12) % (1U << 6);
  out++;
  *out = ((*in) >> 18) % (1U << 6);
  out++;
  *out = ((*in) >> 24) % (1U << 6);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 4)) << (6 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 6);
  out++;
  *out = ((*in) >> 10) % (1U << 6);
  out++;

  return in + 1;
}